

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void set_insert_node(lyxp_set *set,lyd_node *node,uint32_t pos,lyxp_node_type node_type,uint32_t idx
                    )

{
  lyxp_set_node *plVar1;
  uint uVar2;
  
  if ((set == (lyxp_set *)0x0) || (LYXP_SET_NODE_SET < set->type)) {
    __assert_fail("set && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                  ,0x41a,
                  "void set_insert_node(struct lyxp_set *, const struct lyd_node *, uint32_t, enum lyxp_node_type, uint32_t)"
                 );
  }
  if (set->type == LYXP_SET_EMPTY) {
    if (idx != 0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0x420);
    }
    plVar1 = (lyxp_set_node *)malloc(0x20);
    (set->val).nodes = plVar1;
    if (plVar1 == (lyxp_set_node *)0x0) {
LAB_00173623:
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_insert_node");
      return;
    }
    set->type = LYXP_SET_NODE_SET;
    set->size = 2;
    set->ctx_pos = 1;
    set->ctx_size = 1;
    set->ht = (hash_table *)0x0;
    uVar2 = 0;
    idx = 0;
  }
  else {
    uVar2 = set->used;
    if (uVar2 == set->size) {
      plVar1 = (lyxp_set_node *)ly_realloc((set->val).nodes,(ulong)(uVar2 + 2) << 4);
      (set->val).nodes = plVar1;
      if (plVar1 == (lyxp_set_node *)0x0) goto LAB_00173623;
      set->size = set->size + 2;
      uVar2 = set->used;
    }
    if (idx <= uVar2) {
      if (idx <= uVar2 && uVar2 - idx != 0) {
        memmove((set->val).nodes + (ulong)idx + 1,(set->val).nodes + idx,(ulong)(uVar2 - idx) << 4);
        uVar2 = set->used;
      }
    }
    else {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
             ,0x438);
      idx = set->used;
      uVar2 = idx;
    }
  }
  (set->val).nodes[idx].node = node;
  (set->val).nodes[idx].type = node_type;
  (set->val).nodes[idx].pos = pos;
  set->used = uVar2 + 1;
  set_insert_node_hash(set,node,node_type);
  return;
}

Assistant:

static void
set_insert_node(struct lyxp_set *set, const struct lyd_node *node, uint32_t pos, enum lyxp_node_type node_type, uint32_t idx)
{
    assert(set && ((set->type == LYXP_SET_NODE_SET) || (set->type == LYXP_SET_EMPTY)));

    if (set->type == LYXP_SET_EMPTY) {
        /* first item */
        if (idx) {
            /* no real harm done, but it is a bug */
            LOGINT(NULL);
            idx = 0;
        }
        set->val.nodes = malloc(LYXP_SET_SIZE_START * sizeof *set->val.nodes);
        LY_CHECK_ERR_RETURN(!set->val.nodes, LOGMEM(NULL), );
        set->type = LYXP_SET_NODE_SET;
        set->used = 0;
        set->size = LYXP_SET_SIZE_START;
        set->ctx_pos = 1;
        set->ctx_size = 1;
#ifdef LY_ENABLED_CACHE
        set->ht = NULL;
#endif
    } else {
        /* not an empty set */
        if (set->used == set->size) {

            /* set is full */
            set->val.nodes = ly_realloc(set->val.nodes, (set->size + LYXP_SET_SIZE_STEP) * sizeof *set->val.nodes);
            LY_CHECK_ERR_RETURN(!set->val.nodes, LOGMEM(NULL), );
            set->size += LYXP_SET_SIZE_STEP;
        }

        if (idx > set->used) {
            LOGINT(NULL);
            idx = set->used;
        }

        /* make space for the new node */
        if (idx < set->used) {
            memmove(&set->val.nodes[idx + 1], &set->val.nodes[idx], (set->used - idx) * sizeof *set->val.nodes);
        }
    }

    /* finally assign the value */
    set->val.nodes[idx].node = (struct lyd_node *)node;
    set->val.nodes[idx].type = node_type;
    set->val.nodes[idx].pos = pos;
    ++set->used;

#ifdef LY_ENABLED_CACHE
    set_insert_node_hash(set, (struct lyd_node *)node, node_type);
#endif
}